

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_int64_suite::fail_array8_int64_missing_six(void)

{
  value_type input [4];
  decoder decoder;
  undefined4 local_44;
  value local_40;
  uchar local_3c [4];
  decoder local_38;
  
  local_38.input._M_str = local_3c;
  local_3c[0] = 0xae;
  local_3c[1] = '\b';
  local_3c[2] = '\x11';
  local_3c[3] = '\"';
  local_38.input._M_len = 4;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_40 = local_38.current.code;
  local_44 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xabc,"void compact_int64_suite::fail_array8_int64_missing_six()",&local_40,&local_44)
  ;
  return;
}

Assistant:

void fail_array8_int64_missing_six()
{
    const value_type input[] = { token::code::array8_int64, 0x08, 0x11, 0x22 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}